

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_particleSpectra.cpp
# Opt level: O2

void __thiscall
singleParticleSpectra::output_two_particle_correlation_rap(singleParticleSpectra *this)

{
  ostream *poVar1;
  int iorder;
  long lVar2;
  char *pcVar3;
  int i;
  long lVar4;
  int j;
  long lVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double local_ad8;
  double local_ad0;
  char *local_ab8 [4];
  ofstream output_ss;
  undefined8 auStack_a90 [2];
  uint auStack_a80 [122];
  ofstream output_os;
  undefined8 auStack_890 [2];
  uint auStack_880 [122];
  ofstream output;
  undefined8 auStack_690 [2];
  uint auStack_680 [122];
  ostringstream filename_os;
  ostringstream filename_ss;
  ostringstream filename;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&filename);
  poVar1 = std::operator<<((ostream *)&filename,(string *)this);
  poVar1 = std::operator<<(poVar1,"/particle_");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->particle_monval);
  poVar1 = std::operator<<(poVar1,"_vn2_eta12");
  std::operator<<(poVar1,"_pT_");
  poVar1 = std::ostream::_M_insert<double>(this->vn_rapidity_dis_pT_min);
  std::operator<<(poVar1,"_");
  poVar1 = std::ostream::_M_insert<double>(this->vn_rapidity_dis_pT_max);
  std::operator<<(poVar1,".dat");
  std::__cxx11::stringbuf::str();
  std::ofstream::ofstream(&output,_output_ss,_S_out);
  std::__cxx11::string::~string((string *)&output_ss);
  pcVar3 = "# y  vn{2}  vn{2}_err  <Qn*conj(Qn)>  <(Qn*conj(Qn))^2>";
  if (this->rap_type == 0) {
    pcVar3 = "# eta  vn{2}  vn{2}_err  <Qn*conj(Qn)>  <(Qn*conj(Qn))^2>";
  }
  poVar1 = std::operator<<((ostream *)&output,pcVar3);
  std::endl<char,std::char_traits<char>>(poVar1);
  for (lVar4 = 0; lVar4 < this->N_rap; lVar4 = lVar4 + 1) {
    dVar10 = this->drap;
    dVar8 = this->rapidity_dis_min;
    dVar7 = (double)this->total_number_of_events;
    dVar9 = *(double *)
             (*(long *)&(((this->QnSP_eta12).
                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data + lVar4 * 8) / dVar7;
    dVar6 = *(double *)
             (*(long *)&(((this->QnSP_eta12_err).
                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data + lVar4 * 8) / dVar7 - dVar9 * dVar9;
    local_ad0 = 0.0;
    if (0.0 < dVar6) {
      dVar6 = dVar6 / dVar7;
      if (dVar6 < 0.0) {
        local_ad0 = sqrt(dVar6);
      }
      else {
        local_ad0 = SQRT(dVar6);
      }
    }
    *(uint *)((long)auStack_680 + *(long *)(_output + -0x18)) =
         *(uint *)((long)auStack_680 + *(long *)(_output + -0x18)) & 0xfffffefb | 0x100;
    *(undefined8 *)((long)auStack_690 + *(long *)(_output + -0x18) + 8) = 0x12;
    *(undefined8 *)((long)auStack_690 + *(long *)(_output + -0x18)) = 8;
    poVar1 = std::ostream::_M_insert<double>((double)(int)lVar4 * dVar10 + dVar8);
    std::operator<<(poVar1,"  ");
    poVar1 = std::ostream::_M_insert<double>(dVar9);
    std::operator<<(poVar1,"  ");
    poVar1 = std::ostream::_M_insert<double>(local_ad0);
    std::operator<<(poVar1,"  ");
    poVar1 = std::ostream::_M_insert<double>(dVar9);
    std::operator<<(poVar1,"  ");
    poVar1 = std::ostream::_M_insert<double>
                       (*(this->Qn2_vector_err).super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_start /
                        (double)this->total_number_of_events);
    std::operator<<(poVar1,"  ");
    lVar5 = 0x18;
    for (lVar2 = 1; lVar2 < this->order_max; lVar2 = lVar2 + 1) {
      dVar8 = *(double *)
               (*(long *)((long)&(((this->QnSP_eta12).
                                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                 super__Vector_impl_data + lVar5) + lVar4 * 8) /
              (double)this->total_number_of_events;
      local_ad8 = 0.0;
      dVar10 = 0.0;
      if (0.0 < dVar8) {
        dVar10 = dVar8 / dVar9;
        if (dVar10 < 0.0) {
          dVar10 = sqrt(dVar10);
        }
        else {
          dVar10 = SQRT(dVar10);
        }
        dVar6 = *(double *)
                 (*(long *)((long)&(((this->QnSP_eta12_err).
                                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                   super__Vector_impl_data + lVar5) + lVar4 * 8) /
                (double)this->total_number_of_events - dVar8 * dVar8;
        local_ad8 = 0.0;
        if (0.0 < dVar6) {
          dVar6 = dVar6 / (double)this->total_number_of_events;
          if (dVar6 < 0.0) {
            dVar6 = sqrt(dVar6);
          }
          else {
            dVar6 = SQRT(dVar6);
          }
          local_ad8 = dVar6 / dVar9;
        }
      }
      *(uint *)((long)auStack_680 + *(long *)(_output + -0x18)) =
           *(uint *)((long)auStack_680 + *(long *)(_output + -0x18)) & 0xfffffefb | 0x100;
      *(undefined8 *)((long)auStack_690 + *(long *)(_output + -0x18) + 8) = 0x12;
      *(undefined8 *)((long)auStack_690 + *(long *)(_output + -0x18)) = 8;
      poVar1 = std::ostream::_M_insert<double>(dVar10);
      std::operator<<(poVar1,"  ");
      poVar1 = std::ostream::_M_insert<double>(local_ad8);
      std::operator<<(poVar1,"  ");
      poVar1 = std::ostream::_M_insert<double>(dVar8);
      std::operator<<(poVar1,"  ");
      poVar1 = std::ostream::_M_insert<double>
                         (*(double *)
                           (*(long *)((long)&(((this->QnSP_eta12_err).
                                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->
                                             super__Vector_base<double,_std::allocator<double>_>).
                                             _M_impl.super__Vector_impl_data + lVar5) + lVar4 * 8) /
                          (double)this->total_number_of_events);
      std::operator<<(poVar1,"  ");
      lVar5 = lVar5 + 0x18;
    }
    std::endl<char,std::char_traits<char>>((ostream *)&output);
  }
  std::ofstream::close();
  if (this->flag_charge_dependence == 1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&filename_ss);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&filename_os);
    poVar1 = std::operator<<((ostream *)&filename_ss,(string *)this);
    poVar1 = std::operator<<(poVar1,"/particle_");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->particle_monval);
    poVar1 = std::operator<<(poVar1,"_vn2_eta12_ss");
    std::operator<<(poVar1,"_pT_");
    poVar1 = std::ostream::_M_insert<double>(this->vn_rapidity_dis_pT_min);
    std::operator<<(poVar1,"_");
    poVar1 = std::ostream::_M_insert<double>(this->vn_rapidity_dis_pT_max);
    std::operator<<(poVar1,".dat");
    poVar1 = std::operator<<((ostream *)&filename_os,(string *)this);
    poVar1 = std::operator<<(poVar1,"/particle_");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->particle_monval);
    poVar1 = std::operator<<(poVar1,"_vn2_eta12_os");
    std::operator<<(poVar1,"_pT_");
    poVar1 = std::ostream::_M_insert<double>(this->vn_rapidity_dis_pT_min);
    std::operator<<(poVar1,"_");
    poVar1 = std::ostream::_M_insert<double>(this->vn_rapidity_dis_pT_max);
    std::operator<<(poVar1,".dat");
    std::__cxx11::stringbuf::str();
    std::ofstream::ofstream(&output_ss,_output_os,_S_out);
    std::__cxx11::string::~string((string *)&output_os);
    std::__cxx11::stringbuf::str();
    std::ofstream::ofstream(&output_os,local_ab8[0],_S_out);
    std::__cxx11::string::~string((string *)local_ab8);
    if (this->rap_type == 0) {
      pcVar3 = "# eta  vn{2}  vn{2}_err  <Qn*conj(Qn)>  <(Qn*conj(Qn))^2>";
      poVar1 = std::operator<<((ostream *)&output_ss,
                               "# eta  vn{2}  vn{2}_err  <Qn*conj(Qn)>  <(Qn*conj(Qn))^2>");
      std::endl<char,std::char_traits<char>>(poVar1);
    }
    else {
      pcVar3 = "# y  vn{2}  vn{2}_err  <Qn*conj(Qn)>  <(Qn*conj(Qn))^2>";
      poVar1 = std::operator<<((ostream *)&output_ss,
                               "# y  vn{2}  vn{2}_err  <Qn*conj(Qn)>  <(Qn*conj(Qn))^2>");
      std::endl<char,std::char_traits<char>>(poVar1);
    }
    poVar1 = std::operator<<((ostream *)&output_os,pcVar3);
    std::endl<char,std::char_traits<char>>(poVar1);
    for (lVar4 = 0; lVar4 < this->N_rap; lVar4 = lVar4 + 1) {
      dVar7 = (double)(int)lVar4 * this->drap + this->rapidity_dis_min;
      dVar8 = (double)this->total_number_of_events;
      dVar6 = *(double *)
               (*(long *)&(((this->Cn2_ss_eta12).
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data + lVar4 * 8) / dVar8;
      dVar10 = *(double *)
                (*(long *)&(((this->Cn2_ss_eta12_err).
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data + lVar4 * 8) / dVar8 - dVar6 * dVar6;
      local_ad0 = 0.0;
      if (0.0 < dVar10) {
        dVar10 = dVar10 / dVar8;
        if (dVar10 < 0.0) {
          local_ad0 = sqrt(dVar10);
        }
        else {
          local_ad0 = SQRT(dVar10);
        }
      }
      *(uint *)((long)auStack_a80 + *(long *)(_output_ss + -0x18)) =
           *(uint *)((long)auStack_a80 + *(long *)(_output_ss + -0x18)) & 0xfffffefb | 0x100;
      *(undefined8 *)((long)auStack_a90 + *(long *)(_output_ss + -0x18) + 8) = 0x12;
      *(undefined8 *)((long)auStack_a90 + *(long *)(_output_ss + -0x18)) = 8;
      poVar1 = std::ostream::_M_insert<double>(dVar7);
      std::operator<<(poVar1,"  ");
      poVar1 = std::ostream::_M_insert<double>(dVar6);
      std::operator<<(poVar1,"  ");
      poVar1 = std::ostream::_M_insert<double>(local_ad0);
      std::operator<<(poVar1,"  ");
      poVar1 = std::ostream::_M_insert<double>(dVar6);
      std::operator<<(poVar1,"  ");
      std::ostream::_M_insert<double>
                (*(double *)
                  (*(long *)&(((this->Cn2_ss_eta12_err).
                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                             super__Vector_impl_data + lVar4 * 8) /
                 (double)this->total_number_of_events);
      dVar8 = (double)this->total_number_of_events;
      dVar9 = *(double *)
               (*(long *)&(((this->Cn2_os_eta12).
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data + lVar4 * 8) / dVar8;
      dVar10 = *(double *)
                (*(long *)&(((this->Cn2_os_eta12_err).
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data + lVar4 * 8) / dVar8 - dVar9 * dVar9;
      local_ad0 = 0.0;
      if (0.0 < dVar10) {
        dVar10 = dVar10 / dVar8;
        if (dVar10 < 0.0) {
          local_ad0 = sqrt(dVar10);
        }
        else {
          local_ad0 = SQRT(dVar10);
        }
      }
      *(uint *)((long)auStack_880 + *(long *)(_output_os + -0x18)) =
           *(uint *)((long)auStack_880 + *(long *)(_output_os + -0x18)) & 0xfffffefb | 0x100;
      *(undefined8 *)((long)auStack_890 + *(long *)(_output_os + -0x18) + 8) = 0x12;
      *(undefined8 *)((long)auStack_890 + *(long *)(_output_os + -0x18)) = 8;
      poVar1 = std::ostream::_M_insert<double>(dVar7);
      std::operator<<(poVar1,"  ");
      poVar1 = std::ostream::_M_insert<double>(dVar9);
      std::operator<<(poVar1,"  ");
      poVar1 = std::ostream::_M_insert<double>(local_ad0);
      std::operator<<(poVar1,"  ");
      poVar1 = std::ostream::_M_insert<double>(dVar9);
      std::operator<<(poVar1,"  ");
      std::ostream::_M_insert<double>
                (*(double *)
                  (*(long *)&(((this->Cn2_os_eta12_err).
                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                             super__Vector_impl_data + lVar4 * 8) /
                 (double)this->total_number_of_events);
      lVar5 = 0x18;
      for (lVar2 = 1; lVar2 < this->order_max; lVar2 = lVar2 + 1) {
        dVar8 = *(double *)
                 (*(long *)((long)&(((this->Cn2_ss_eta12).
                                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                   super__Vector_impl_data + lVar5) + lVar4 * 8) /
                (double)this->total_number_of_events;
        dVar10 = 0.0;
        local_ad8 = 0.0;
        if (0.0 < dVar8) {
          dVar10 = dVar8 / dVar6;
          if (dVar10 < 0.0) {
            dVar10 = sqrt(dVar10);
          }
          else {
            dVar10 = SQRT(dVar10);
          }
          dVar7 = *(double *)
                   (*(long *)((long)&(((this->Cn2_ss_eta12_err).
                                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                     super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                     super__Vector_impl_data + lVar5) + lVar4 * 8) /
                  (double)this->total_number_of_events - dVar8 * dVar8;
          local_ad8 = 0.0;
          if (0.0 < dVar7) {
            dVar7 = dVar7 / (double)this->total_number_of_events;
            if (dVar7 < 0.0) {
              dVar7 = sqrt(dVar7);
            }
            else {
              dVar7 = SQRT(dVar7);
            }
            local_ad8 = dVar7 / dVar6;
          }
        }
        *(uint *)((long)auStack_a80 + *(long *)(_output_ss + -0x18)) =
             *(uint *)((long)auStack_a80 + *(long *)(_output_ss + -0x18)) & 0xfffffefb | 0x100;
        *(undefined8 *)((long)auStack_a90 + *(long *)(_output_ss + -0x18) + 8) = 0x12;
        *(undefined8 *)((long)auStack_a90 + *(long *)(_output_ss + -0x18)) = 8;
        poVar1 = std::ostream::_M_insert<double>(dVar10);
        std::operator<<(poVar1,"  ");
        poVar1 = std::ostream::_M_insert<double>(local_ad8);
        std::operator<<(poVar1,"  ");
        poVar1 = std::ostream::_M_insert<double>(dVar8);
        std::operator<<(poVar1,"  ");
        poVar1 = std::ostream::_M_insert<double>
                           (*(double *)
                             (*(long *)((long)&(((this->Cn2_ss_eta12_err).
                                                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->
                                               super__Vector_base<double,_std::allocator<double>_>).
                                               _M_impl.super__Vector_impl_data + lVar5) + lVar4 * 8)
                            / (double)this->total_number_of_events);
        std::operator<<(poVar1,"  ");
        dVar8 = *(double *)
                 (*(long *)((long)&(((this->Cn2_os_eta12).
                                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                   super__Vector_impl_data + lVar5) + lVar4 * 8) /
                (double)this->total_number_of_events;
        dVar10 = 0.0;
        local_ad8 = 0.0;
        if (0.0 < dVar8) {
          dVar10 = dVar8 / dVar9;
          if (dVar10 < 0.0) {
            dVar10 = sqrt(dVar10);
          }
          else {
            dVar10 = SQRT(dVar10);
          }
          dVar7 = *(double *)
                   (*(long *)((long)&(((this->Cn2_os_eta12_err).
                                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                     super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                     super__Vector_impl_data + lVar5) + lVar4 * 8) /
                  (double)this->total_number_of_events - dVar8 * dVar8;
          local_ad8 = 0.0;
          if (0.0 < dVar7) {
            dVar7 = dVar7 / (double)this->total_number_of_events;
            if (dVar7 < 0.0) {
              dVar7 = sqrt(dVar7);
            }
            else {
              dVar7 = SQRT(dVar7);
            }
            local_ad8 = dVar7 / dVar9;
          }
        }
        *(uint *)((long)auStack_880 + *(long *)(_output_os + -0x18)) =
             *(uint *)((long)auStack_880 + *(long *)(_output_os + -0x18)) & 0xfffffefb | 0x100;
        *(undefined8 *)((long)auStack_890 + *(long *)(_output_os + -0x18) + 8) = 0x12;
        *(undefined8 *)((long)auStack_890 + *(long *)(_output_os + -0x18)) = 8;
        poVar1 = std::ostream::_M_insert<double>(dVar10);
        std::operator<<(poVar1,"  ");
        poVar1 = std::ostream::_M_insert<double>(local_ad8);
        std::operator<<(poVar1,"  ");
        poVar1 = std::ostream::_M_insert<double>(dVar8);
        std::operator<<(poVar1,"  ");
        poVar1 = std::ostream::_M_insert<double>
                           (*(double *)
                             (*(long *)((long)&(((this->Cn2_os_eta12_err).
                                                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->
                                               super__Vector_base<double,_std::allocator<double>_>).
                                               _M_impl.super__Vector_impl_data + lVar5) + lVar4 * 8)
                            / (double)this->total_number_of_events);
        std::operator<<(poVar1,"  ");
        lVar5 = lVar5 + 0x18;
      }
      std::endl<char,std::char_traits<char>>((ostream *)&output_ss);
      std::endl<char,std::char_traits<char>>((ostream *)&output_os);
    }
    std::ofstream::close();
    std::ofstream::close();
    std::ofstream::~ofstream(&output_os);
    std::ofstream::~ofstream(&output_ss);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&filename_os);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&filename_ss);
  }
  std::ofstream::~ofstream(&output);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&filename);
  return;
}

Assistant:

void singleParticleSpectra::output_two_particle_correlation_rap() {
    ostringstream filename;
    filename << path_ << "/particle_" << particle_monval << "_vn2_eta12"
             << "_pT_" << vn_rapidity_dis_pT_min << "_"
             << vn_rapidity_dis_pT_max << ".dat";
    ofstream output(filename.str().c_str());
    if (rap_type == 0) {
        output << "# eta  vn{2}  vn{2}_err  <Qn*conj(Qn)>  <(Qn*conj(Qn))^2>"
               << endl;
    } else {
        output << "# y  vn{2}  vn{2}_err  <Qn*conj(Qn)>  <(Qn*conj(Qn))^2>"
               << endl;
    }

    for (int i = 0; i < N_rap; i++) {
        double eta_local = rapidity_dis_min + i * drap;
        double num_pair = QnSP_eta12[0][i] / total_number_of_events;
        double num_pair_stdsq =
            (QnSP_eta12_err[0][i] / total_number_of_events
             - num_pair * num_pair);
        double num_pair_err = 0.0;
        if (num_pair_stdsq > 0) {
            num_pair_err = sqrt(num_pair_stdsq / total_number_of_events);
        }
        output << scientific << setw(18) << setprecision(8) << eta_local << "  "
               << num_pair << "  " << num_pair_err << "  " << num_pair << "  "
               << Qn2_vector_err[0] / total_number_of_events << "  ";
        for (int iorder = 1; iorder < order_max; iorder++) {
            double vn2_avg = 0.0;
            double vn2_err = 0.0;
            double Qn2_avg = QnSP_eta12[iorder][i] / total_number_of_events;
            if (Qn2_avg > 0.) {
                vn2_avg = sqrt(Qn2_avg / num_pair);
                double Qn2_stdsq =
                    (QnSP_eta12_err[iorder][i] / total_number_of_events
                     - Qn2_avg * Qn2_avg);
                if (Qn2_stdsq > 0) {
                    double Qn2_err = sqrt(Qn2_stdsq / total_number_of_events);
                    vn2_err = Qn2_err / num_pair;
                }
            }
            output << scientific << setw(18) << setprecision(8) << vn2_avg
                   << "  " << vn2_err << "  " << Qn2_avg << "  "
                   << QnSP_eta12_err[iorder][i] / total_number_of_events
                   << "  ";
        }
        output << endl;
    }
    output.close();

    if (flag_charge_dependence == 1) {
        ostringstream filename_ss, filename_os;
        filename_ss << path_ << "/particle_" << particle_monval
                    << "_vn2_eta12_ss"
                    << "_pT_" << vn_rapidity_dis_pT_min << "_"
                    << vn_rapidity_dis_pT_max << ".dat";
        filename_os << path_ << "/particle_" << particle_monval
                    << "_vn2_eta12_os"
                    << "_pT_" << vn_rapidity_dis_pT_min << "_"
                    << vn_rapidity_dis_pT_max << ".dat";
        ofstream output_ss(filename_ss.str().c_str());
        ofstream output_os(filename_os.str().c_str());
        if (rap_type == 0) {
            output_ss
                << "# eta  vn{2}  vn{2}_err  <Qn*conj(Qn)>  <(Qn*conj(Qn))^2>"
                << endl;
            output_os
                << "# eta  vn{2}  vn{2}_err  <Qn*conj(Qn)>  <(Qn*conj(Qn))^2>"
                << endl;
        } else {
            output_ss
                << "# y  vn{2}  vn{2}_err  <Qn*conj(Qn)>  <(Qn*conj(Qn))^2>"
                << endl;
            output_os
                << "# y  vn{2}  vn{2}_err  <Qn*conj(Qn)>  <(Qn*conj(Qn))^2>"
                << endl;
        }
        for (int j = 0; j < N_rap; j++) {
            double eta_local = rapidity_dis_min + j * drap;

            double num_pair_ss = Cn2_ss_eta12[0][j] / total_number_of_events;
            double num_pair_ss_stdsq =
                (Cn2_ss_eta12_err[0][j] / total_number_of_events
                 - num_pair_ss * num_pair_ss);
            double num_pair_ss_err = 0.0;
            if (num_pair_ss_stdsq > 0) {
                num_pair_ss_err =
                    (sqrt(num_pair_ss_stdsq / total_number_of_events));
            }
            output_ss << scientific << setw(18) << setprecision(8) << eta_local
                      << "  " << num_pair_ss << "  " << num_pair_ss_err << "  "
                      << num_pair_ss << "  "
                      << Cn2_ss_eta12_err[0][j] / total_number_of_events;

            double num_pair_os = Cn2_os_eta12[0][j] / total_number_of_events;
            double num_pair_os_stdsq =
                (Cn2_os_eta12_err[0][j] / total_number_of_events
                 - num_pair_os * num_pair_os);
            double num_pair_os_err = 0.0;
            if (num_pair_os_stdsq > 0) {
                num_pair_os_err =
                    (sqrt(num_pair_os_stdsq / total_number_of_events));
            }
            output_os << scientific << setw(18) << setprecision(8) << eta_local
                      << "  " << num_pair_os << "  " << num_pair_os_err << "  "
                      << num_pair_os << "  "
                      << Cn2_os_eta12_err[0][j] / total_number_of_events;

            for (int i = 1; i < order_max; i++) {
                double vn2_avg = 0.0;
                double vn2_err = 0.0;
                double Cn2_ss_avg =
                    (Cn2_ss_eta12[i][j] / total_number_of_events);
                if (Cn2_ss_avg > 0.) {
                    vn2_avg = sqrt(Cn2_ss_avg / num_pair_ss);
                    double Cn2_ss_stdsq =
                        (Cn2_ss_eta12_err[i][j] / total_number_of_events
                         - Cn2_ss_avg * Cn2_ss_avg);
                    double Cn2_ss_err = 0.0;
                    if (Cn2_ss_stdsq > 0) {
                        Cn2_ss_err =
                            sqrt(Cn2_ss_stdsq / total_number_of_events);
                        vn2_err = Cn2_ss_err / num_pair_ss;
                    }
                }
                output_ss << scientific << setw(18) << setprecision(8)
                          << vn2_avg << "  " << vn2_err << "  " << Cn2_ss_avg
                          << "  "
                          << Cn2_ss_eta12_err[i][j] / total_number_of_events
                          << "  ";

                vn2_avg = 0.0;
                vn2_err = 0.0;
                double Cn2_os_avg =
                    (Cn2_os_eta12[i][j] / total_number_of_events);
                if (Cn2_os_avg > 0.) {
                    vn2_avg = sqrt(Cn2_os_avg / num_pair_os);
                    double Cn2_os_stdsq =
                        (Cn2_os_eta12_err[i][j] / total_number_of_events
                         - Cn2_os_avg * Cn2_os_avg);
                    double Cn2_os_err = 0.0;
                    if (Cn2_os_stdsq > 0) {
                        Cn2_os_err =
                            sqrt(Cn2_os_stdsq / total_number_of_events);
                        vn2_err = Cn2_os_err / num_pair_os;
                    }
                }
                output_os << scientific << setw(18) << setprecision(8)
                          << vn2_avg << "  " << vn2_err << "  " << Cn2_os_avg
                          << "  "
                          << Cn2_os_eta12_err[i][j] / total_number_of_events
                          << "  ";
            }
            output_ss << endl;
            output_os << endl;
        }
        output_ss.close();
        output_os.close();
    }
}